

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

string * __thiscall
hgdb::json::SymbolTable::output_abi_cxx11_(string *__return_storage_ptr__,SymbolTable *this)

{
  pointer puVar1;
  Module *pMVar2;
  pointer pVVar3;
  JSONWriter *pJVar4;
  _Base_ptr p_Var5;
  unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *m;
  pointer puVar6;
  Variable *v;
  pointer this_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  JSONWriter w;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&w);
  JSONWriter::begin_obj(&w);
  name._M_str = "generator";
  name._M_len = 9;
  pJVar4 = JSONWriter::key(&w,name);
  std::__cxx11::string::string((string *)&local_1f8,(string *)this);
  JSONWriter::value<std::__cxx11::string>(pJVar4,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  if ((this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    name_00._M_str = "top";
    name_00._M_len = 3;
    pJVar4 = JSONWriter::key(&w,name_00);
    std::__cxx11::string::string
              ((string *)&bStack_218,
               (string *)
               ((this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
    JSONWriter::value<std::__cxx11::string>(pJVar4,&bStack_218);
    std::__cxx11::string::~string((string *)&bStack_218);
  }
  else {
    name_01._M_str = "top";
    name_01._M_len = 3;
    pJVar4 = JSONWriter::key(&w,name_01);
    JSONWriter::begin_array(pJVar4);
    for (p_Var5 = (this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->top_names_)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      std::__cxx11::string::string((string *)&local_1d8,(string *)(p_Var5 + 1));
      JSONWriter::value<std::__cxx11::string>(&w,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    JSONWriter::end_array(&w);
  }
  name_02._M_str = "table";
  name_02._M_len = 5;
  pJVar4 = JSONWriter::key(&w,name_02);
  JSONWriter::begin_array(pJVar4);
  puVar1 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->modules_).
                super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    pMVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>.
             _M_t.
             super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>.
             super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl;
    (*(code *)*(pMVar2->super_Scope<hgdb::json::Module>).super_ScopeBase._vptr_ScopeBase)(pMVar2,&w)
    ;
  }
  JSONWriter::end_array(&w);
  if ((this->variables_).
      super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->variables_).
      super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    name_03._M_str = "variables";
    name_03._M_len = 9;
    JSONWriter::key(&w,name_03);
    JSONWriter::begin_array(&w);
    pVVar3 = (this->variables_).
             super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (this_00 = (this->variables_).
                   super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_00 != pVVar3;
        this_00 = this_00 + 1) {
      Variable::serialize(this_00,&w);
    }
    JSONWriter::end_array(&w);
  }
  if (this->reorder_ == false) {
    name_04._M_str = "reorder";
    name_04._M_len = 7;
    pJVar4 = JSONWriter::key(&w,name_04);
    JSONWriter::value<bool>(pJVar4,false);
  }
  JSONWriter::end_obj(&w);
  JSONWriter::str_abi_cxx11_(__return_storage_ptr__,&w);
  std::__cxx11::stringstream::~stringstream((stringstream *)&w);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string output() const {
        JSONWriter w;
        w.begin_obj();
        w.key("generator").value(framework_name_);

        if (top_names_.size() == 1) {
            w.key("top").value(*top_names_.begin());
        } else {
            w.key("top").begin_array();
            for (auto const &n : top_names_) w.value(n);
            w.end_array();
        }

        w.key("table").begin_array();
        for (auto const &m : modules_) {
            m->serialize(w);
        }
        w.end_array();

        if (!variables_.empty()) {
            w.key("variables");
            w.begin_array();
            for (auto const &v : variables_) {
                v.serialize(w);
            }
            w.end_array();
        }

        // attributes
        if (!reorder_) {
            w.key("reorder").value(false);
        }

        w.end_obj();
        return w.str();
    }